

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrerequisiteTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::StateResetCase::iterate(StateResetCase *this)

{
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  TestError *e;
  StateResetCase *this_local;
  
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  ctxInfo = Context::getContextInfo((this->super_TestCase).m_context);
  glu::resetState(renderCtx,ctxInfo);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

TestCase::IterateResult StateResetCase::iterate (void)
{
	try
	{
		glu::resetState(m_context.getRenderContext(), m_context.getContextInfo());
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (const tcu::TestError& e)
	{
		m_testCtx.getLog() << e;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return TestCase::STOP;
}